

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,Builder *param_2)

{
  Reader local_98;
  Reader local_50;
  
  DynamicList::Builder::asReader(&local_50,param_2);
  local_98.type = LIST;
  local_98.field_1.listValue.schema.elementType.baseType = local_50.schema.elementType.baseType;
  local_98.field_1.listValue.schema.elementType.listDepth = local_50.schema.elementType.listDepth;
  local_98.field_1.listValue.schema.elementType.isImplicitParam =
       local_50.schema.elementType.isImplicitParam;
  local_98.field_1.listValue.schema.elementType.field_3 = local_50.schema.elementType.field_3;
  local_98.field_1.intValue._6_2_ = local_50.schema.elementType._6_2_;
  local_98.field_1._8_8_ = local_50.schema.elementType.field_4.scopeId;
  local_98.field_1.listValue.reader.segment = local_50.reader.segment;
  local_98.field_1.listValue.reader.capTable = local_50.reader.capTable;
  local_98.field_1.listValue.reader.ptr = local_50.reader.ptr;
  local_98.field_1.listValue.reader.elementCount = local_50.reader.elementCount;
  local_98.field_1.listValue.reader.step = local_50.reader.step;
  local_98.field_1.listValue.reader.structDataSize = local_50.reader.structDataSize;
  local_98.field_1.listValue.reader.structPointerCount = local_50.reader.structPointerCount;
  local_98.field_1.listValue.reader.elementSize = local_50.reader.elementSize;
  local_98.field_1.field12[0x37] = local_50.reader._39_1_;
  local_98.field_1._56_8_ = local_50.reader._40_8_;
  anon_unknown_2::stringify(__return_storage_ptr__,&local_98);
  DynamicValue::Reader::~Reader(&local_98);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(const DynamicList::Builder& value) { return stringify(value.asReader()); }